

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  char *__s;
  Offset OVar1;
  long *plVar2;
  long *plVar3;
  size_t sVar4;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar5;
  unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> func_type;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_40;
  long *local_38;
  
  __s = this->filename_;
  sVar4 = strlen(__s);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  tVar5.super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       operator_new(0x48);
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(char **)((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                   .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) = __s
  ;
  *(size_t *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) = sVar4;
  *(Offset *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
  *(undefined ***)
   tVar5.
   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
   super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       &PTR__TypeModuleField_00196470;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = 0;
  MakeUnique<wabt::FuncType>();
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)((long)local_38 + 0x50),param_types,
             param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)((long)local_38 + 0x68),result_types,
             result_types + result_count);
  plVar3 = local_38;
  local_38 = (long *)0x0;
  plVar2 = *(long **)((long)tVar5.
                            super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                            .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                     0x40);
  *(long **)((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                   .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) =
       plVar3;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       tVar5.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)&local_40);
  if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl != (TypeModuleField *)0x0)
  {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)0x0;
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  auto func_type = MakeUnique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);
  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}